

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *param_1,Cluster *cl,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *absolute_transform,aiNode *parent,aiNode *root_node)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
  *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  pointer puVar4;
  pointer puVar5;
  iterator __position;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
  *this_01;
  undefined8 uVar33;
  const_iterator cVar34;
  Logger *pLVar35;
  ostream *poVar36;
  mapped_type *ppaVar37;
  aiBone *paVar38;
  ulong uVar39;
  aiVertexWeight *__s;
  long lVar40;
  unsigned_long uVar41;
  size_t __n;
  ulong uVar42;
  FBXConverter *this_02;
  unsigned_long uVar43;
  long lVar44;
  string deformer_name;
  aiString bone_name;
  aiBone *local_630;
  long *local_628;
  long local_618 [2];
  string local_608;
  char *local_5e8;
  float fStack_5e0;
  float fStack_5dc;
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
  *local_5d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_5d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_5c8;
  vector<aiBone*,std::allocator<aiBone*>> *local_5c0;
  char *local_5b8;
  undefined1 local_5b0 [32];
  aiBone *local_590;
  ios_base local_540 [268];
  uint local_434;
  char local_430 [1024];
  
  local_5c8 = index_out_indices;
  local_5c0 = (vector<aiBone*,std::allocator<aiBone*>> *)param_1;
  if (cl == (Cluster *)0x0) {
    __assert_fail("cl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x63b,
                  "void Assimp::FBX::FBXConverter::ConvertCluster(std::vector<aiBone *> &, const Cluster *, std::vector<size_t> &, std::vector<size_t> &, std::vector<size_t> &, const aiMatrix4x4 &, aiNode *, aiNode *)"
                 );
  }
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  this_02 = (FBXConverter *)(cl->node->super_Object).name._M_dataplus._M_p;
  local_5d0 = count_out_indices;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_608,this_02,
             (pointer)((long)&this_02->defaultMaterialIndex +
                      (cl->node->super_Object).name._M_string_length));
  FixNodeName((string *)local_5b0,this_02,&local_608);
  uVar33 = local_5b0._0_8_;
  __n = 0x3ff;
  if ((local_5b0._8_8_ & 0xfffffc00) == 0) {
    __n = local_5b0._8_8_ & 0xffffffff;
  }
  local_434 = (uint)__n;
  memcpy(local_430,(void *)local_5b0._0_8_,__n);
  local_430[__n] = '\0';
  if ((undefined1 *)uVar33 != local_5b0 + 0x10) {
    operator_delete((void *)uVar33,local_5b0._16_8_ + 1);
  }
  local_630 = (aiBone *)0x0;
  this_00 = &this->bone_map;
  cVar34 = std::
           _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
           ::find(&this_00->_M_t,&local_608);
  if ((_Rb_tree_header *)cVar34._M_node == &(this->bone_map)._M_t._M_impl.super__Rb_tree_header) {
    pLVar35 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[18]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
               (char (*) [18])"created new bone ");
    local_5b8 = local_430;
    poVar36 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_5b0,&local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,". Deformer: ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar36,local_608._M_dataplus._M_p,local_608._M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar35,(char *)local_628);
    if (local_628 != local_618) {
      operator_delete(local_628,local_618[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    paVar38 = (aiBone *)operator_new(0x460);
    local_5e8 = (paVar38->mName).data;
    (paVar38->mName).data[0] = '\0';
    memset((paVar38->mName).data + 1,0x1b,0x3ff);
    paVar38->mNumWeights = 0;
    paVar38->mWeights = (aiVertexWeight *)0x0;
    uVar42 = (ulong)local_434;
    (paVar38->mName).length = local_434;
    local_630 = paVar38;
    local_5d8 = (_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
                 *)this_00;
    memcpy(local_5e8,local_430,uVar42);
    (paVar38->mName).data[uVar42] = '\0';
    fVar1 = (cl->transformLink).a2;
    fVar2 = (cl->transformLink).a3;
    fVar3 = (cl->transformLink).a4;
    fVar6 = (cl->transformLink).b1;
    fVar7 = (cl->transformLink).b2;
    fVar8 = (cl->transformLink).b3;
    fVar9 = (cl->transformLink).b4;
    fVar10 = (cl->transformLink).c1;
    fVar11 = (cl->transformLink).c2;
    fVar12 = (cl->transformLink).c3;
    fVar13 = (cl->transformLink).c4;
    fVar14 = (cl->transformLink).d1;
    fVar15 = (cl->transformLink).d2;
    fVar16 = (cl->transformLink).d3;
    fVar17 = (cl->transformLink).d4;
    (paVar38->mOffsetMatrix).a1 = (cl->transformLink).a1;
    (paVar38->mOffsetMatrix).a2 = fVar1;
    (paVar38->mOffsetMatrix).a3 = fVar2;
    (paVar38->mOffsetMatrix).a4 = fVar3;
    (paVar38->mOffsetMatrix).b1 = fVar6;
    (paVar38->mOffsetMatrix).b2 = fVar7;
    (paVar38->mOffsetMatrix).b3 = fVar8;
    (paVar38->mOffsetMatrix).b4 = fVar9;
    (paVar38->mOffsetMatrix).c1 = fVar10;
    (paVar38->mOffsetMatrix).c2 = fVar11;
    (paVar38->mOffsetMatrix).c3 = fVar12;
    (paVar38->mOffsetMatrix).c4 = fVar13;
    (paVar38->mOffsetMatrix).d1 = fVar14;
    (paVar38->mOffsetMatrix).d2 = fVar15;
    (paVar38->mOffsetMatrix).d3 = fVar16;
    (paVar38->mOffsetMatrix).d4 = fVar17;
    aiMatrix4x4t<float>::Inverse(&paVar38->mOffsetMatrix);
    fVar6 = (paVar38->mOffsetMatrix).a1;
    fVar7 = (paVar38->mOffsetMatrix).a2;
    fVar8 = (paVar38->mOffsetMatrix).a3;
    fVar9 = (paVar38->mOffsetMatrix).a4;
    fVar10 = (paVar38->mOffsetMatrix).b1;
    fVar11 = (paVar38->mOffsetMatrix).b2;
    fVar12 = (paVar38->mOffsetMatrix).b3;
    fVar13 = (paVar38->mOffsetMatrix).b4;
    fVar14 = (paVar38->mOffsetMatrix).c1;
    fVar15 = (paVar38->mOffsetMatrix).c2;
    fVar16 = (paVar38->mOffsetMatrix).c3;
    fVar17 = (paVar38->mOffsetMatrix).c4;
    fVar18 = (paVar38->mOffsetMatrix).d1;
    fVar19 = absolute_transform->a1;
    fVar20 = absolute_transform->a2;
    fVar21 = absolute_transform->a3;
    fVar22 = absolute_transform->a4;
    fVar23 = absolute_transform->b1;
    fVar24 = absolute_transform->b2;
    fVar25 = absolute_transform->b3;
    fVar26 = absolute_transform->b4;
    fVar27 = absolute_transform->c1;
    fVar28 = absolute_transform->c2;
    local_5e8._0_4_ = absolute_transform->c1;
    local_5e8._4_4_ = absolute_transform->c2;
    fStack_5e0 = absolute_transform->c3;
    fStack_5dc = absolute_transform->c4;
    fVar29 = absolute_transform->d1;
    fVar30 = absolute_transform->d2;
    fVar31 = absolute_transform->d3;
    fVar32 = absolute_transform->d4;
    fVar1 = (paVar38->mOffsetMatrix).d2;
    fVar2 = (paVar38->mOffsetMatrix).d3;
    fVar3 = (paVar38->mOffsetMatrix).d4;
    (paVar38->mOffsetMatrix).a1 = fVar9 * fVar29 + fVar8 * fVar27 + fVar6 * fVar19 + fVar7 * fVar23;
    (paVar38->mOffsetMatrix).a2 = fVar9 * fVar30 + fVar8 * fVar28 + fVar6 * fVar20 + fVar7 * fVar24;
    (paVar38->mOffsetMatrix).a3 =
         fVar9 * fVar31 + fVar8 * fStack_5e0 + fVar6 * fVar21 + fVar7 * fVar25;
    (paVar38->mOffsetMatrix).a4 =
         fVar9 * fVar32 + fVar8 * fStack_5dc + fVar6 * fVar22 + fVar7 * fVar26;
    (paVar38->mOffsetMatrix).b1 =
         fVar13 * fVar29 + fVar12 * fVar27 + fVar10 * fVar19 + fVar11 * fVar23;
    (paVar38->mOffsetMatrix).b2 =
         fVar13 * fVar30 + fVar12 * fVar28 + fVar10 * fVar20 + fVar11 * fVar24;
    (paVar38->mOffsetMatrix).b3 =
         fVar13 * fVar31 + fVar12 * fStack_5e0 + fVar10 * fVar21 + fVar11 * fVar25;
    (paVar38->mOffsetMatrix).b4 =
         fVar13 * fVar32 + fVar12 * fStack_5dc + fVar10 * fVar22 + fVar11 * fVar26;
    (paVar38->mOffsetMatrix).c1 =
         fVar17 * fVar29 + fVar16 * fVar27 + fVar14 * fVar19 + fVar15 * fVar23;
    (paVar38->mOffsetMatrix).c2 =
         fVar17 * fVar30 + fVar16 * fVar28 + fVar14 * fVar20 + fVar15 * fVar24;
    (paVar38->mOffsetMatrix).c3 =
         fVar17 * fVar31 + fVar16 * fStack_5e0 + fVar14 * fVar21 + fVar15 * fVar25;
    (paVar38->mOffsetMatrix).c4 =
         fVar17 * fVar32 + fVar16 * fStack_5dc + fVar14 * fVar22 + fVar15 * fVar26;
    (paVar38->mOffsetMatrix).d1 = fVar3 * fVar29 + fVar2 * fVar27 + fVar18 * fVar19 + fVar1 * fVar23
    ;
    (paVar38->mOffsetMatrix).d2 = fVar3 * fVar30 + fVar2 * fVar28 + fVar18 * fVar20 + fVar1 * fVar24
    ;
    (paVar38->mOffsetMatrix).d3 =
         fVar3 * fVar31 + fVar2 * fStack_5e0 + fVar18 * fVar21 + fVar1 * fVar25;
    (paVar38->mOffsetMatrix).d4 =
         fVar3 * fVar32 + fVar2 * fStack_5dc + fVar18 * fVar22 + fVar1 * fVar26;
    puVar4 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    uVar39 = (long)puVar5 - (long)puVar4;
    paVar38->mNumWeights = (uint)(uVar39 >> 3);
    uVar42 = 0xffffffffffffffff;
    if (-1 < (long)uVar39) {
      uVar42 = uVar39;
    }
    __s = (aiVertexWeight *)operator_new__(uVar42);
    lVar44 = (long)puVar5 - (long)puVar4;
    if (lVar44 != 0) {
      memset(__s,0,(lVar44 - 8U & 0xfffffffffffffff8) + 8);
    }
    this_01 = local_5d8;
    paVar38->mWeights = __s;
    lVar44 = (long)(local_5c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(local_5c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar44 != 0) {
      lVar44 = lVar44 >> 3;
      lVar40 = 0;
      do {
        uVar41 = (local_5c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar40];
        if (uVar41 != 0xffffffffffffffff) {
          for (uVar43 = (local_5d0->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar40]; uVar43 != 0; uVar43 = uVar43 - 1)
          {
            __s->mVertexId =
                 (uint)(out_indices->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar41];
            __s->mWeight = (cl->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar40];
            __s = __s + 1;
            uVar41 = uVar41 + 1;
          }
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != lVar44 + (ulong)(lVar44 == 0));
    }
    local_5b0._0_8_ = local_5b0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_5b0,local_608._M_dataplus._M_p,
               local_608._M_dataplus._M_p + local_608._M_string_length);
    paVar38 = local_630;
    local_590 = local_630;
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,aiBone*>,std::_Select1st<std::pair<std::__cxx11::string_const,aiBone*>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,aiBone*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,aiBone*>>
              (this_01,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>
                        *)local_5b0);
    if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
      operator_delete((void *)local_5b0._0_8_,local_5b0._16_8_ + 1);
    }
  }
  else {
    pLVar35 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[28]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
               (char (*) [28])"retrieved bone from lookup ");
    local_5b8 = local_430;
    poVar36 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        local_5b0,&local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,". Deformer:",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar36,local_608._M_dataplus._M_p,local_608._M_string_length);
    std::__cxx11::stringbuf::str();
    Logger::debug(pLVar35,(char *)local_628);
    if (local_628 != local_618) {
      operator_delete(local_628,local_618[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    ppaVar37 = std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiBone_*>_>_>
               ::operator[](this_00,&local_608);
    paVar38 = *ppaVar37;
    local_630 = paVar38;
  }
  pLVar35 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[31]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
             (char (*) [31])"bone research: Indicies size: ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar35,(char *)local_628);
  if (local_628 != local_618) {
    operator_delete(local_628,local_618[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  __position._M_current = *(aiBone ***)(local_5c0 + 8);
  if (__position._M_current == *(aiBone ***)(local_5c0 + 0x10)) {
    std::vector<aiBone*,std::allocator<aiBone*>>::_M_realloc_insert<aiBone*const&>
              (local_5c0,__position,&local_630);
  }
  else {
    *__position._M_current = paVar38;
    *(long *)(local_5c0 + 8) = *(long *)(local_5c0 + 8) + 8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone *> &local_mesh_bones, const Cluster *cl,
                                          std::vector<size_t> &out_indices, std::vector<size_t> &index_out_indices,
                                          std::vector<size_t> &count_out_indices, const aiMatrix4x4 &absolute_transform,
                                          aiNode *parent, aiNode *root_node) {
            ai_assert(cl); // make sure cluster valid
            std::string deformer_name = cl->TargetNode()->Name();
            aiString bone_name = aiString(FixNodeName(deformer_name));

            aiBone *bone = nullptr;

            if (bone_map.count(deformer_name)) {
				ASSIMP_LOG_DEBUG_F("retrieved bone from lookup ", bone_name.C_Str(), ". Deformer:", deformer_name);
				bone = bone_map[deformer_name];
			} else {
				ASSIMP_LOG_DEBUG_F("created new bone ", bone_name.C_Str(), ". Deformer: ", deformer_name);
				bone = new aiBone();
                bone->mName = bone_name;

                // store local transform link for post processing
                bone->mOffsetMatrix = cl->TransformLink();
                bone->mOffsetMatrix.Inverse();

                aiMatrix4x4 matrix = (aiMatrix4x4)absolute_transform;

                bone->mOffsetMatrix = bone->mOffsetMatrix * matrix; // * mesh_offset


                //
                // Now calculate the aiVertexWeights
                //

                aiVertexWeight *cursor = nullptr;

                bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
                cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

                const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
                const WeightArray& weights = cl->GetWeights();

                const size_t c = index_out_indices.size();
                for (size_t i = 0; i < c; ++i) {
                    const size_t index_index = index_out_indices[i];

                    if (index_index == no_index_sentinel) {
                        continue;
                    }

                    const size_t cc = count_out_indices[i];
                    for (size_t j = 0; j < cc; ++j) {
                        // cursor runs from first element relative to the start
                        // or relative to the start of the next indexes.
                        aiVertexWeight& out_weight = *cursor++;

                        out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                        out_weight.mWeight = weights[i];
                    }
                }

                bone_map.insert(std::pair<const std::string, aiBone *>(deformer_name, bone));
            }

            ASSIMP_LOG_DEBUG_F("bone research: Indicies size: ", out_indices.size());

            // lookup must be populated in case something goes wrong
            // this also allocates bones to mesh instance outside
            local_mesh_bones.push_back(bone);
        }